

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O0

void prf_state_pop(prf_state_t *state)

{
  int iVar1;
  long in_RDI;
  matrix4x4_f32_t *m2;
  matrix4x4_f32_t *m1;
  
  if (*(int *)(in_RDI + 0x58) == 0) {
    if (*(ushort *)(in_RDI + 0x7e) < 2) {
      *(undefined4 *)(in_RDI + 0x58) = 1;
    }
    else {
      iVar1 = memcmp(*(void **)(*(long *)(in_RDI + 0x48) +
                               (long)(int)(*(ushort *)(in_RDI + 0x7e) - 1) * 8),
                     *(void **)(*(long *)(in_RDI + 0x48) + (ulong)*(ushort *)(in_RDI + 0x7e) * 8),
                     0x40);
      if (iVar1 != 0) {
        *(undefined4 *)(in_RDI + 0x58) = 1;
      }
    }
  }
  *(short *)(in_RDI + 0x7e) = *(short *)(in_RDI + 0x7e) + -1;
  prf_debug(1,"state popped to level %d",(ulong)*(ushort *)(in_RDI + 0x7e));
  return;
}

Assistant:

void
prf_state_pop(
    prf_state_t * state )
{
    assert( state != NULL );

    if ( state->inv_dirty == FALSE) {
        if ( state->state_push_level > 1 ) {
            matrix4x4_f32_t * m1, * m2;
            m1 = state->matrix[state->state_push_level-1];
            m2 = state->matrix[state->state_push_level];
            if ( memcmp( m1, m2, sizeof( matrix4x4_f32_t ) ) != 0 )
                state->inv_dirty = TRUE;
        } else {
            state->inv_dirty = TRUE;
        }
    }
    state->state_push_level--;
    prf_debug( 1, "state popped to level %d", state->state_push_level );
}